

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O0

int luaB_coresume(lua_State *L)

{
  int iVar1;
  lua_State *co_00;
  int r;
  lua_State *co;
  lua_State *L_local;
  
  co_00 = lua_tothread(L,1);
  if (co_00 == (lua_State *)0x0) {
    luaL_argerror(L,1,"coroutine expected");
  }
  iVar1 = lua_gettop(L);
  iVar1 = auxresume(L,co_00,iVar1 + -1);
  if (iVar1 < 0) {
    lua_pushboolean(L,0);
    lua_insert(L,-2);
    L_local._4_4_ = 2;
  }
  else {
    lua_pushboolean(L,1);
    lua_insert(L,-(iVar1 + 1));
    L_local._4_4_ = iVar1 + 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_coresume (lua_State *L) {
  lua_State *co = lua_tothread(L, 1);
  int r;
  luaL_argcheck(L, co, 1, "coroutine expected");
  r = auxresume(L, co, lua_gettop(L) - 1);
  if (r < 0) {
    lua_pushboolean(L, 0);
    lua_insert(L, -2);
    return 2;  /* return false + error message */
  }
  else {
    lua_pushboolean(L, 1);
    lua_insert(L, -(r + 1));
    return r + 1;  /* return true + `resume' returns */
  }
}